

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O2

bool __thiscall duckdb::FileSystem::IsPathAbsolute(FileSystem *this,string *path)

{
  bool bVar1;
  bool bVar2;
  string path_separator;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30;
  
  (*this->_vptr_FileSystem[0x18])(&local_30,this,path);
  bVar1 = PathMatched(path,&local_30);
  bVar2 = true;
  if (!bVar1) {
    ::std::__cxx11::string::string((string *)&local_50,(string *)path);
    ::std::__cxx11::string::string((string *)&local_70,"file:/",&local_71);
    bVar2 = StringUtil::StartsWith(&local_50,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  ::std::__cxx11::string::~string((string *)&local_30);
  return bVar2;
}

Assistant:

bool FileSystem::IsPathAbsolute(const string &path) {
	auto path_separator = PathSeparator(path);
	return PathMatched(path, path_separator) || StringUtil::StartsWith(path, "file:/");
}